

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  Simulation *pSVar2;
  ostream *poVar3;
  double mu;
  double lambda;
  Sink sink;
  AvgQueueSizeStat avgSizeStat;
  Queue que;
  Source source;
  double local_338;
  string local_330;
  RandomVar local_310;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  double local_2d8;
  RandomVar local_2d0;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  double local_2b0;
  Entity local_2a8;
  undefined4 local_278;
  AvgQueueSizeStat local_270;
  Queue local_208;
  Source local_e8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"          ###### M/M/1 example ######\n\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Insert lambda : ",0x10);
  std::istream::_M_extract<double>((double *)&std::cin);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Insert mu : ",0xc);
  std::istream::_M_extract<double>((double *)&std::cin);
  if (local_2d8 < local_338) {
    MetaSim::RandomVar::RandomVar(&local_2d0);
    local_2e8 = 0;
    uStack_2e4 = 0;
    uStack_2e0 = 0;
    uStack_2dc = 0x3ff00000;
    local_2c0 = 0;
    uStack_2bc = 0;
    uStack_2b8 = 0;
    uStack_2b4 = 0x3ff00000;
    local_2d0._vptr_RandomVar = (_func_int **)&PTR_clone_00124a48;
    local_2b0 = local_2d8;
    MetaSim::RandomVar::RandomVar(&local_310);
    local_300 = CONCAT44(uStack_2e4,local_2e8);
    uStack_2f8 = CONCAT44(uStack_2dc,uStack_2e0);
    local_310._vptr_RandomVar = (_func_int **)&PTR_clone_00124a48;
    Node::Node((Node *)&local_2a8,"sink");
    local_2a8._vptr_Entity = (_func_int **)&PTR__Entity_00124440;
    local_278 = 0;
    Queue::Queue(&local_208,(Node *)&local_2a8,&local_2d0,"M/M/1 queue");
    Source::Source(&local_e8,&local_208.super_Node,&local_310,"source");
    AvgQueueSizeStat::AvgQueueSizeStat(&local_270,&local_208,"avg_queue_size");
    MetaSim::attach_stat<Source::ProduceEvent,AvgQueueSizeStat>(&local_270,&local_e8._prodEvent);
    MetaSim::BaseStat::setTransitory((Tick)0x7d0);
    pSVar2 = MetaSim::Simulation::getInstance();
    MetaSim::DebugStream::setStream(&pSVar2->dbg,"log.txt");
    pSVar2 = MetaSim::Simulation::getInstance();
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"All","");
    MetaSim::DebugStream::enable(&pSVar2->dbg,&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    pSVar2 = MetaSim::Simulation::getInstance();
    MetaSim::Simulation::run(pSVar2,(Tick)0x1e8480,8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The average queue length is ",0x1c);
    dVar1 = MetaSim::BaseStat::getMean((BaseStat *)&local_270);
    poVar3 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"with a 95% confidence interval of ",0x22);
    dVar1 = MetaSim::BaseStat::getConfInterval((BaseStat *)&local_270,C95);
    poVar3 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    MetaSim::BaseStat::~BaseStat((BaseStat *)&local_270);
    local_e8.super_Node.super_Entity._vptr_Entity = (_func_int **)&PTR__Source_00124590;
    MetaSim::Event::~Event(&local_e8._prodEvent.super_Event);
    MetaSim::Entity::~Entity((Entity *)&local_e8);
    local_208.super_Node.super_Entity._vptr_Entity = (_func_int **)&PTR__Queue_001244f0;
    MetaSim::Event::~Event(&local_208._servEvent.super_Event);
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_208._q.super__Deque_base<int,_std::allocator<int>_>);
    MetaSim::Entity::~Entity((Entity *)&local_208);
    MetaSim::Entity::~Entity(&local_2a8);
    MetaSim::RandomVar::~RandomVar(&local_310);
    MetaSim::RandomVar::~RandomVar(&local_2d0);
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "lambda must be less than mu (otherwise is unstable!!)");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

int main() 
{
        double lambda, mu;

        cout << "          ###### M/M/1 example ######\n\n";

        cout << "Insert lambda : ";
        cin >> lambda;

        cout << "Insert mu : ";
        cin >> mu;

        if (lambda >= mu) {
                cout << "lambda must be less than mu (otherwise is unstable!!)" 
                     << endl;
                exit(-1);
        }

        ExponentialVar st(lambda);
        ExponentialVar at(mu);

        Sink sink("sink");
        Queue que(&sink, &st, "M/M/1 queue");
        Source source(&que, &at, "source");

        AvgQueueSizeStat avgSizeStat(que, "avg_queue_size");
        //avgSizeStat.attach(&source);
        attach_stat(avgSizeStat, source._prodEvent);

        BaseStat::setTransitory(2000);
  
        SIMUL.dbg.setStream("log.txt");
        SIMUL.dbg.enable("All");

        SIMUL.run(2000000, 8);

        cout << "The average queue length is " 
             << avgSizeStat.getMean() << endl;
        cout << "with a 95% confidence interval of " 
             << avgSizeStat.getConfInterval(BaseStat::C95) << endl;
}